

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O0

Nwk_Man_t * Nwk_ManAlloc(void)

{
  Nwk_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  Aig_MmFlex_t *pAVar2;
  Hop_Man_t *pHVar3;
  Nwk_Man_t *p;
  
  __s = (Nwk_Man_t *)malloc(0x80);
  memset(__s,0,0x80);
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vCis = pVVar1;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vCos = pVVar1;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vObjs = pVVar1;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vTemp = pVVar1;
  __s->nFanioPlus = 2;
  pAVar2 = Aig_MmFlexStart();
  __s->pMemObjs = pAVar2;
  pHVar3 = Hop_ManStart();
  __s->pManHop = pHVar3;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Man_t * Nwk_ManAlloc()
{
    Nwk_Man_t * p;
    p = ABC_ALLOC( Nwk_Man_t, 1 );
    memset( p, 0, sizeof(Nwk_Man_t) );
    p->vCis = Vec_PtrAlloc( 1000 );
    p->vCos = Vec_PtrAlloc( 1000 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vTemp = Vec_PtrAlloc( 1000 );
    p->nFanioPlus = 2;
    p->pMemObjs = Aig_MmFlexStart();
    p->pManHop = Hop_ManStart();
    return p;
}